

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.hpp
# Opt level: O3

void __thiscall MetaSim::RandomVar::MaxException::MaxException(MaxException *this,string *cl)

{
  pointer pcVar1;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Maximum value cannot be computed for this variable type","");
  pcVar1 = (cl->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + cl->_M_string_length);
  Exc::Exc(&this->super_Exc,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_Exc).super_BaseExc = &PTR__BaseExc_00123ce8;
  return;
}

Assistant:

MaxException(std::string cl)
                :Exc("Maximum value cannot be computed for this variable type", cl) {}